

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

wchar_t yes(char *fmt,...)

{
  char cVar1;
  char in_AL;
  ssize_t sVar2;
  ushort **ppuVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [8];
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined4 local_68;
  undefined4 local_64;
  va_list ap;
  wchar_t read_fd;
  ssize_t l;
  char *p;
  char buff [32];
  char *fmt_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  ap[0].reg_save_area._4_4_ = 2;
  ap[0].overflow_arg_area = local_118;
  ap[0]._0_8_ = &stack0x00000008;
  local_64 = 0x30;
  local_68 = 8;
  local_110 = in_RSI;
  local_108 = in_RDX;
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  buff._24_8_ = fmt;
  vfprintf(_stderr,fmt,&local_68);
  fprintf(_stderr," (y/N)? ");
  fflush(_stderr);
  sVar2 = read(ap[0].reg_save_area._4_4_,&p,0x1f);
  if (sVar2 < 0) {
    fprintf(_stderr,"Keyboard read failed\n");
    exit(1);
  }
  if (sVar2 != 0) {
    buff[sVar2 + -8] = '\0';
    for (l = (ssize_t)&p; *(char *)l != '\0'; l = l + 1) {
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[(int)(uint)*(byte *)l] & 0x2000) == 0) {
        cVar1 = *(char *)l;
        if (cVar1 == 'N') {
          return L'\0';
        }
        if (cVar1 != 'Y') {
          if (cVar1 == 'n') {
            return L'\0';
          }
          if (cVar1 != 'y') {
            return L'\0';
          }
        }
        return L'\x01';
      }
    }
  }
  return L'\0';
}

Assistant:

int
yes(const char *fmt, ...)
{
	char buff[32];
	char *p;
	ssize_t l;
	int read_fd = 2; /* stderr */

	va_list ap;
	va_start(ap, fmt);
	vfprintf(stderr, fmt, ap);
	va_end(ap);
	fprintf(stderr, " (y/N)? ");
	fflush(stderr);

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* To be resilient when stdin is a pipe, bsdtar prefers to read from
	 * stderr.  On Windows, stderr cannot be read. The nearest "piping
	 * resilient" equivalent is reopening the console input handle.
	 */
	read_fd = _open("CONIN$", O_RDONLY);
	if (read_fd < 0) {
	  fprintf(stderr, "Keyboard read failed\n");
	  exit(1);
	}
#endif

	l = read(read_fd, buff, sizeof(buff) - 1);

#if defined(_WIN32) && !defined(__CYGWIN__)
	_close(read_fd);
#endif

	if (l < 0) {
	  fprintf(stderr, "Keyboard read failed\n");
	  exit(1);
	}
	if (l == 0)
		return (0);
	buff[l] = 0;

	for (p = buff; *p != '\0'; p++) {
		if (isspace((unsigned char)*p))
			continue;
		switch(*p) {
		case 'y': case 'Y':
			return (1);
		case 'n': case 'N':
			return (0);
		default:
			return (0);
		}
	}

	return (0);
}